

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O3

void __thiscall wasm::ReferenceFinder::visitCallIndirect(ReferenceFinder *this,CallIndirect *curr)

{
  pointer *pppVar1;
  iterator __position;
  uintptr_t uVar2;
  iterator __position_00;
  size_t sVar3;
  char *pcVar4;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  pair<wasm::ModuleItemKind,_wasm::Name> local_30;
  
  sVar3 = (curr->table).super_IString.str._M_len;
  pcVar4 = (curr->table).super_IString.str._M_str;
  local_40 = (undefined4)sVar3;
  uStack_3c = (undefined4)(sVar3 >> 0x20);
  uStack_38 = SUB84(pcVar4,0);
  uStack_34 = (undefined4)((ulong)pcVar4 >> 0x20);
  local_30.first = Table;
  local_30.second.super_IString.str._M_str._4_4_ = uStack_34;
  local_30.second.super_IString.str._M_len._0_4_ = local_40;
  local_30.second.super_IString.str._M_len._4_4_ = uStack_3c;
  local_30.second.super_IString.str._M_str._0_4_ = uStack_38;
  __position._M_current =
       (this->elements).
       super__Vector_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elements).
      super__Vector_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<wasm::ModuleItemKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleItemKind,wasm::Name>>>
    ::_M_realloc_insert<std::pair<wasm::ModuleItemKind,wasm::Name>const&>
              ((vector<std::pair<wasm::ModuleItemKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleItemKind,wasm::Name>>>
                *)&this->elements,__position,&local_30);
  }
  else {
    ((__position._M_current)->second).super_IString.str._M_str = pcVar4;
    *(ulong *)__position._M_current = CONCAT44(uStack_44,1);
    ((__position._M_current)->second).super_IString.str._M_len = sVar3;
    pppVar1 = &(this->elements).
               super__Vector_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  uVar2 = (curr->heapType).id;
  local_30.first = (ModuleItemKind)uVar2;
  local_30._4_4_ = SUB84(uVar2 >> 0x20,0);
  __position_00._M_current =
       (this->callRefTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->callRefTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_realloc_insert<wasm::HeapType_const&>
              ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&this->callRefTypes,
               __position_00,(HeapType *)&local_30);
  }
  else {
    (__position_00._M_current)->id = uVar2;
    (this->callRefTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
    .super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    note({ModuleElementKind::Table, curr->table});
    // Note a possible call of a function reference as well, as something might
    // be written into the table during runtime. With precise tracking of what
    // is written into the table we could do better here; we could also see
    // which tables are immutable. TODO
    noteCallRef(curr->heapType);
  }